

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bool.cc
# Opt level: O3

int d2i_ASN1_BOOLEAN(int *a,uchar **pp,long length)

{
  int iVar1;
  int val;
  CBS cbs;
  int local_24;
  CBS local_20;
  
  if (-1 < length) {
    local_20.data = *pp;
    local_20.len = length;
    iVar1 = CBS_get_asn1_bool(&local_20,&local_24);
    if (iVar1 == 0) {
      ERR_put_error(0xc,0,0x6d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_bool.cc"
                    ,0x2b);
      iVar1 = -1;
    }
    else {
      iVar1 = 0xff;
      if (local_24 == 0) {
        iVar1 = 0;
      }
      if (a != (int *)0x0) {
        *a = iVar1;
      }
      *pp = local_20.data;
    }
    return iVar1;
  }
  return -1;
}

Assistant:

ASN1_BOOLEAN d2i_ASN1_BOOLEAN(ASN1_BOOLEAN *out, const unsigned char **inp,
                              long len) {
  if (len < 0) {
    return ASN1_BOOLEAN_NONE;
  }

  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  int val;
  if (!CBS_get_asn1_bool(&cbs, &val)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
    return ASN1_BOOLEAN_NONE;
  }

  ASN1_BOOLEAN ret = val ? ASN1_BOOLEAN_TRUE : ASN1_BOOLEAN_FALSE;
  if (out != NULL) {
    *out = ret;
  }
  *inp = CBS_data(&cbs);
  return ret;
}